

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O2

void __thiscall
google::protobuf::GeneratedCodeInfo_Annotation::Clear(GeneratedCodeInfo_Annotation *this)

{
  uint uVar1;
  undefined8 *puVar2;
  
  (this->path_).current_size_ = 0;
  uVar1 = (this->_has_bits_).has_bits_[0];
  if ((uVar1 & 1) != 0) {
    puVar2 = (undefined8 *)((ulong)(this->source_file_).tagged_ptr_.ptr_ & 0xfffffffffffffffe);
    puVar2[1] = 0;
    *(undefined1 *)*puVar2 = 0;
  }
  if ((uVar1 & 6) != 0) {
    this->begin_ = 0;
    this->end_ = 0;
  }
  (this->_has_bits_).has_bits_[0] = 0;
  internal::InternalMetadata::Clear<google::protobuf::UnknownFieldSet>
            (&(this->super_Message).super_MessageLite._internal_metadata_);
  return;
}

Assistant:

inline void RepeatedField<Element>::Clear() {
  current_size_ = 0;
}